

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observator.hpp
# Opt level: O2

void __thiscall
Observator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
notifyAllObserver(Observator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this)

{
  bool bVar1;
  __node_base *p_Var2;
  __node_base *p_Var3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> toRemove;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
  obsEvents;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
  local_88;
  
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = &(this->_observers)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
    ::pair(&local_88,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
            *)(p_Var3 + 1));
    p_Var2 = &local_88.second._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      bVar1 = std::function<bool_()>::operator()((function<bool_()> *)(p_Var2 + 2));
      if (bVar1) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                   (unsigned_long *)(p_Var2 + 1));
      }
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
    ::~pair(&local_88);
  }
  unregisterIds(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

void notifyAllObserver() {
        std::vector<ListenerConnection> toRemove;

        for (const auto obsEvents : this->_observers) {
            for (const auto &obs : obsEvents.second) {
                if (obs.second()) {
                    toRemove.emplace_back(obs.first);
                }
            }
        }

        this->unregisterIds(toRemove);
    }